

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O1

void av1_set_entropy_contexts
               (MACROBLOCKD *xd,macroblockd_plane *pd,int plane,BLOCK_SIZE plane_bsize,
               TX_SIZE tx_size,int has_eob,int aoff,int loff)

{
  int iVar1;
  ENTROPY_CONTEXT *__s;
  int iVar2;
  undefined7 in_register_00000081;
  ulong uVar3;
  int iVar4;
  ENTROPY_CONTEXT *__s_00;
  
  __s = pd->above_entropy_context + aoff;
  __s_00 = pd->left_entropy_context + loff;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) << 2);
  iVar1 = *(int *)((long)tx_size_wide_unit + uVar3);
  iVar4 = *(int *)((long)tx_size_high_unit + uVar3);
  iVar2 = has_eob;
  if ((has_eob != 0) && (xd->mb_to_right_edge < 0)) {
    iVar2 = ((int)((xd->mb_to_right_edge >> ((char)xd->plane[plane].subsampling_x + 3U & 0x1f)) +
                  (uint)block_size_wide[plane_bsize]) >> 2) - aoff;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    memset(__s,has_eob,(long)iVar2);
    __s = __s + iVar2;
    iVar1 = iVar1 - iVar2;
    iVar2 = 0;
  }
  memset(__s,iVar2,(long)iVar1);
  if ((has_eob != 0) && (xd->mb_to_bottom_edge < 0)) {
    iVar1 = ((int)((xd->mb_to_bottom_edge >> ((char)xd->plane[plane].subsampling_y + 3U & 0x1f)) +
                  (uint)block_size_high[plane_bsize]) >> 2) - loff;
    if (iVar4 < iVar1) {
      iVar1 = iVar4;
    }
    memset(__s_00,has_eob,(long)iVar1);
    __s_00 = __s_00 + iVar1;
    iVar4 = iVar4 - iVar1;
    has_eob = 0;
  }
  memset(__s_00,has_eob,(long)iVar4);
  return;
}

Assistant:

void av1_set_entropy_contexts(const MACROBLOCKD *xd,
                              struct macroblockd_plane *pd, int plane,
                              BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                              int has_eob, int aoff, int loff) {
  ENTROPY_CONTEXT *const a = pd->above_entropy_context + aoff;
  ENTROPY_CONTEXT *const l = pd->left_entropy_context + loff;
  const int txs_wide = tx_size_wide_unit[tx_size];
  const int txs_high = tx_size_high_unit[tx_size];

  // above
  if (has_eob && xd->mb_to_right_edge < 0) {
    const int blocks_wide = max_block_wide(xd, plane_bsize, plane);
    const int above_contexts = AOMMIN(txs_wide, blocks_wide - aoff);
    memset(a, has_eob, sizeof(*a) * above_contexts);
    memset(a + above_contexts, 0, sizeof(*a) * (txs_wide - above_contexts));
  } else {
    memset(a, has_eob, sizeof(*a) * txs_wide);
  }

  // left
  if (has_eob && xd->mb_to_bottom_edge < 0) {
    const int blocks_high = max_block_high(xd, plane_bsize, plane);
    const int left_contexts = AOMMIN(txs_high, blocks_high - loff);
    memset(l, has_eob, sizeof(*l) * left_contexts);
    memset(l + left_contexts, 0, sizeof(*l) * (txs_high - left_contexts));
  } else {
    memset(l, has_eob, sizeof(*l) * txs_high);
  }
}